

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O0

uint8_t nibble(char c)

{
  uint8_t local_9;
  char c_local;
  
  if (c < 'a') {
    if (c < 'A') {
      if (c < '0' || '9' < c) {
        __assert_fail("c >= \'0\' && c <= \'9\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/pal_spec.cpp"
                      ,0x26,"nibble");
      }
      local_9 = c + 0xd0;
    }
    else {
      if ('F' < c) {
        __assert_fail("c <= \'F\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/pal_spec.cpp"
                      ,0x23,"nibble");
      }
      local_9 = c + 0xc9;
    }
  }
  else {
    if ('f' < c) {
      __assert_fail("c <= \'f\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/pal_spec.cpp"
                    ,0x20,"nibble");
    }
    local_9 = c + 0xa9;
  }
  return local_9;
}

Assistant:

constexpr uint8_t nibble(char c) {
	if (c >= 'a') {
		assert(c <= 'f');
		return c - 'a' + 10;
	} else if (c >= 'A') {
		assert(c <= 'F');
		return c - 'A' + 10;
	} else {
		assert(c >= '0' && c <= '9');
		return c - '0';
	}
}